

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O0

int64_t __thiscall
aeron::archive::AeronArchive::startRecording
          (AeronArchive *this,string *channel,int32_t streamId,Value sourceLocation)

{
  int64_t iVar1;
  anon_class_32_4_fdb68e3d local_60;
  function<bool_(long)> local_40;
  Value local_20;
  int32_t local_1c;
  Value sourceLocation_local;
  int32_t streamId_local;
  string *channel_local;
  AeronArchive *this_local;
  
  local_60.streamId = &local_1c;
  local_60.sourceLocation = &local_20;
  local_60.this = this;
  local_60.channel = channel;
  local_20 = sourceLocation;
  local_1c = streamId;
  _sourceLocation_local = channel;
  channel_local = (string *)this;
  std::function<bool(long)>::
  function<aeron::archive::AeronArchive::startRecording(std::__cxx11::string_const&,int,io::aeron::archive::codecs::SourceLocation::Value)::__0,void>
            ((function<bool(long)> *)&local_40,&local_60);
  iVar1 = callAndPollForResponse(this,&local_40,"start recording");
  std::function<bool_(long)>::~function(&local_40);
  return iVar1;
}

Assistant:

std::int64_t AeronArchive::startRecording(const std::string& channel, std::int32_t streamId,
                                          codecs::SourceLocation::Value sourceLocation) {
    return callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return archiveProxy_->startRecording(channel, streamId, sourceLocation, correlationId, controlSessionId_);
        },
        "start recording");
}